

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_math.h
# Opt level: O0

uint32 lzham::math::next_pow2(uint32 val)

{
  uint uVar1;
  uint32 val_local;
  
  uVar1 = val - 1 >> 0x10 | val - 1;
  uVar1 = uVar1 >> 8 | uVar1;
  uVar1 = uVar1 >> 4 | uVar1;
  uVar1 = uVar1 >> 2 | uVar1;
  return (uVar1 >> 1 | uVar1) + 1;
}

Assistant:

inline uint32 next_pow2(uint32 val)
      {
         val--;
         val |= val >> 16;
         val |= val >> 8;
         val |= val >> 4;
         val |= val >> 2;
         val |= val >> 1;
         return val + 1;
      }